

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

int __thiscall Fl_Text_Display::longest_vline(Fl_Text_Display *this)

{
  int iVar1;
  int visLineNum;
  int iVar2;
  
  if (0 < this->mNVisibleLines) {
    visLineNum = 0;
    iVar2 = 0;
    do {
      iVar1 = measure_vline(this,visLineNum);
      if (iVar1 < iVar2) {
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      visLineNum = visLineNum + 1;
    } while (visLineNum < this->mNVisibleLines);
    return iVar2;
  }
  return 0;
}

Assistant:

int Fl_Text_Display::longest_vline() const {
  int longest = 0;
  for (int i = 0; i < mNVisibleLines; i++)
    longest = max(longest, measure_vline(i));
  return longest;
}